

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisig_tests.cpp
# Opt level: O2

void __thiscall multisig_tests::multisig_verify::test_method(multisig_verify *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  CScript *pCVar4;
  CMutableTransaction *in;
  iterator in_R8;
  iterator pvVar5;
  CTransaction *pCVar6;
  iterator in_R9;
  iterator pvVar7;
  pointer pCVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  char *in_stack_fffffffffffffa10;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  int local_52c;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  uint local_32c;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  vector<CKey,_std::allocator<CKey>_> keys;
  ScriptError err;
  string local_2a8;
  CTransaction local_288;
  undefined1 local_208 [32];
  CScript s;
  CMutableTransaction txTo [3];
  CMutableTransaction txFrom;
  CScript escrow;
  CScript a_or_b;
  CScript a_and_b;
  CKey key [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  do {
    (&key[0].fCompressed)[lVar3] = false;
    *(undefined8 *)
     ((long)&key[0].keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    CKey::MakeNewKey((CKey *)(&key[0].fCompressed + lVar3),true);
  }
  a_and_b.super_CScriptBase._union._16_8_ = 0;
  a_and_b.super_CScriptBase._24_8_ = 0;
  a_and_b.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  a_and_b.super_CScriptBase._union._8_8_ = 0;
  pCVar4 = CScript::operator<<(&a_and_b,OP_2);
  CKey::GetPubKey((CPubKey *)txTo,key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom,(CPubKey *)txTo);
  pCVar4 = CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &txFrom);
  CKey::GetPubKey((CPubKey *)&local_288,key + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&a_or_b,(CPubKey *)&local_288)
  ;
  pCVar4 = CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &a_or_b);
  pCVar4 = CScript::operator<<(pCVar4,OP_2);
  CScript::operator<<(pCVar4,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&a_or_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom);
  a_or_b.super_CScriptBase._union._16_8_ = 0;
  a_or_b.super_CScriptBase._24_8_ = 0;
  a_or_b.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  a_or_b.super_CScriptBase._union._8_8_ = 0;
  pCVar4 = CScript::operator<<(&a_or_b,OP_1);
  CKey::GetPubKey((CPubKey *)txTo,key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom,(CPubKey *)txTo);
  pCVar4 = CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &txFrom);
  CKey::GetPubKey((CPubKey *)&local_288,key + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&escrow,(CPubKey *)&local_288)
  ;
  pCVar4 = CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &escrow);
  pCVar4 = CScript::operator<<(pCVar4,OP_2);
  CScript::operator<<(pCVar4,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&escrow);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom);
  escrow.super_CScriptBase._union._16_8_ = 0;
  escrow.super_CScriptBase._24_8_ = 0;
  escrow.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  escrow.super_CScriptBase._union._8_8_ = 0;
  pCVar4 = CScript::operator<<(&escrow,OP_2);
  CKey::GetPubKey((CPubKey *)txTo,key);
  in = txTo;
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s,(CPubKey *)in);
  pCVar4 = CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
  CKey::GetPubKey((CPubKey *)&local_288,key + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208,
             (CPubKey *)&local_288);
  pCVar4 = CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_208);
  CKey::GetPubKey((CPubKey *)&txFrom,key + 2);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8,(CPubKey *)&txFrom)
  ;
  pCVar4 = CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &local_2a8);
  pCVar4 = CScript::operator<<(pCVar4,OP_3);
  CScript::operator<<(pCVar4,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
  CMutableTransaction::CMutableTransaction(&txFrom);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txFrom.vout,3);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &a_and_b.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             &a_or_b.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,
             &escrow.super_CScriptBase);
  lVar3 = 0;
  do {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0xa8);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&in->vin,1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&in->vout,1);
    (((in->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).n = (uint32_t)lVar3;
    CMutableTransaction::GetHash((Txid *)&local_288,&txFrom);
    pCVar8 = (in->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)((long)&(pCVar8->prevout).hash + 0x10) =
         local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(pointer *)((long)&(pCVar8->prevout).hash + 0x18) =
         local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)&(pCVar8->prevout).hash =
         local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)((long)&(pCVar8->prevout).hash + 8) =
         local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ((in->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 1;
    in = in + 1;
  }
  keys.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  keys.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  keys.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  s.super_CScriptBase._union._16_8_ = 0;
  s.super_CScriptBase._24_8_ = 0;
  s.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  s.super_CScriptBase._union._8_8_ = 0;
  std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&keys,1,key);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,key + 1);
  CTransaction::CTransaction(&local_288,txTo);
  sign_multisig((CScript *)local_208,&a_and_b,&keys,&local_288,(int)in_R8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&s.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
  CTransaction::~CTransaction(&local_288);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_00000050;
  file.m_begin = (iterator)&local_2d8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2e8,msg);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR_CheckECDSASignature_0114a720;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)txTo;
  local_2a8._M_dataplus._M_p._0_1_ =
       VerifyScript(&s,&a_and_b,(CScriptWitness *)0x0,3,(BaseSignatureChecker *)&local_288,&err);
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  local_208._24_8_ = local_368;
  local_368._0_8_ =
       "VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_368._8_8_ = "";
  local_208[8] = '\0';
  local_208._0_8_ = &PTR__lazy_ostream_011481f0;
  local_208._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_2f0 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a8,(lazy_ostream *)local_208,1,0,WARN,
             (check_type)in_stack_fffffffffffffa10,(size_t)&local_2f8,0x50);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x51;
  file_00.m_begin = (iterator)&local_308;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,
             msg_00);
  local_2a8._M_dataplus._M_p._0_1_ = err == SCRIPT_ERR_OK;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  ScriptErrorString_abi_cxx11_((string *)local_208,err);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01147fb0;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_320 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = &DAT_00000001;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
             (check_type)in_stack_fffffffffffffa10,(size_t)&local_328,0x51);
  std::__cxx11::string::~string((string *)local_208);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
  local_32c = 0;
  while( true ) {
    if (3 < (int)local_32c) break;
    std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&keys,1,key + (int)local_32c);
    CTransaction::CTransaction(&local_288,txTo);
    sign_multisig((CScript *)local_208,&a_and_b,&keys,&local_288,(int)pvVar5);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&s.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
    CTransaction::~CTransaction(&local_288);
    local_340 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_338 = "";
    aStack_358._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    local_348 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x57;
    file_01.m_begin = (iterator)&local_340;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
               (size_t)(local_368 + 0x18),msg_01);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR_CheckECDSASignature_0114a720;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)txTo;
    bVar2 = VerifyScript(&s,&a_and_b,(CScriptWitness *)0x0,3,(BaseSignatureChecker *)&local_288,&err
                        );
    local_368._8_8_ = (element_type *)0x0;
    aStack_358._M_allocated_capacity = 0;
    local_368[0] = (class_property<bool>)(class_property<bool>)!bVar2;
    tinyformat::format<int>(&local_2a8,"a&b 1: %d",(int *)&local_32c);
    local_208[8] = '\0';
    local_208._0_8_ = &PTR__lazy_ostream_01147fb0;
    local_208._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_378 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_370 = "";
    pvVar5 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_208._24_8_ = &local_2a8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
               (check_type)in_stack_fffffffffffffa10,(size_t)&local_378,0x57);
    std::__cxx11::string::~string((string *)&local_2a8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
    local_388 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_380 = "";
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = &DAT_00000058;
    file_02.m_begin = (iterator)&local_388;
    msg_02.m_end = pvVar7;
    msg_02.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_398,
               msg_02);
    local_2a8._M_dataplus._M_p._0_1_ = err == SCRIPT_ERR_INVALID_STACK_OPERATION;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_allocated_capacity = 0;
    ScriptErrorString_abi_cxx11_((string *)local_208,err);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_01147fb0;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_3a0 = "";
    pvVar5 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_208;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
               (check_type)in_stack_fffffffffffffa10,(size_t)&local_3a8,0x58);
    std::__cxx11::string::~string((string *)local_208);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
    std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&keys,1,key + 1);
    std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,key + (int)local_32c);
    CTransaction::CTransaction(&local_288,txTo);
    sign_multisig((CScript *)local_208,&a_and_b,&keys,&local_288,(int)pvVar5);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&s.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
    CTransaction::~CTransaction(&local_288);
    local_3b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_3b0 = "";
    local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x5d;
    file_03.m_begin = (iterator)&local_3b8;
    msg_03.m_end = pvVar7;
    msg_03.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3c8,
               msg_03);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR_CheckECDSASignature_0114a720;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)txTo;
    bVar2 = VerifyScript(&s,&a_and_b,(CScriptWitness *)0x0,3,(BaseSignatureChecker *)&local_288,&err
                        );
    local_368[0] = (class_property<bool>)(class_property<bool>)!bVar2;
    local_368._8_8_ = (element_type *)0x0;
    aStack_358._M_allocated_capacity = 0;
    tinyformat::format<int>(&local_2a8,"a&b 2: %d",(int *)&local_32c);
    local_208[8] = '\0';
    local_208._0_8_ = &PTR__lazy_ostream_01147fb0;
    local_208._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_3d0 = "";
    pvVar5 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_208._24_8_ = &local_2a8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
               (check_type)in_stack_fffffffffffffa10,(size_t)&local_3d8,0x5d);
    std::__cxx11::string::~string((string *)&local_2a8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
    local_3e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_3e0 = "";
    local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x5e;
    file_04.m_begin = (iterator)&local_3e8;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3f8,
               msg_04);
    local_2a8._M_dataplus._M_p._0_1_ = err == SCRIPT_ERR_EVAL_FALSE;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_allocated_capacity = 0;
    ScriptErrorString_abi_cxx11_((string *)local_208,err);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_01147fb0;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_408 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_400 = "";
    pvVar5 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_208;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
               (check_type)in_stack_fffffffffffffa10,(size_t)&local_408,0x5e);
    std::__cxx11::string::~string((string *)local_208);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
    local_32c = local_32c + 1;
  }
  local_32c = 0;
  while( true ) {
    pCVar8 = (pointer)(txTo + 1);
    if (3 < (int)local_32c) break;
    std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&keys,1,key + (int)local_32c);
    CTransaction::CTransaction(&local_288,(CMutableTransaction *)pCVar8);
    sign_multisig((CScript *)local_208,&a_or_b,&keys,&local_288,(int)pvVar5);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&s.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
    CTransaction::~CTransaction(&local_288);
    if (local_32c < 2) {
      local_418 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_410 = "";
      local_428 = &boost::unit_test::basic_cstring<char_const>::null;
      local_420 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = &DAT_00000068;
      file_05.m_begin = (iterator)&local_418;
      msg_05.m_end = pvVar7;
      msg_05.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_428,
                 msg_05);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_0114a720;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar8;
      bVar2 = VerifyScript(&s,&a_or_b,(CScriptWitness *)0x0,3,(BaseSignatureChecker *)&local_288,
                           &err);
      local_368[0] = (class_property<bool>)(class_property<bool>)bVar2;
      local_368._8_8_ = (element_type *)0x0;
      aStack_358._M_allocated_capacity = 0;
      tinyformat::format<int>(&local_2a8,"a|b: %d",(int *)&local_32c);
      local_208[8] = '\0';
      local_208._0_8_ = &PTR__lazy_ostream_01147fb0;
      local_208._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_438 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_430 = "";
      pvVar5 = &DAT_00000001;
      pvVar7 = &DAT_00000001;
      local_208._24_8_ = &local_2a8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
                 (check_type)in_stack_fffffffffffffa10,(size_t)&local_438,0x68);
      std::__cxx11::string::~string((string *)&local_2a8);
      boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
      local_448 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_440 = "";
      local_458 = &boost::unit_test::basic_cstring<char_const>::null;
      local_450 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x69;
      file_06.m_begin = (iterator)&local_448;
      msg_06.m_end = pvVar7;
      msg_06.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_458,
                 msg_06);
      local_2a8._M_dataplus._M_p._0_1_ = err == SCRIPT_ERR_OK;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_allocated_capacity = 0;
      ScriptErrorString_abi_cxx11_((string *)local_208,err);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01147fb0;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      local_468 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_460 = "";
      pvVar5 = &DAT_00000001;
      pvVar7 = &DAT_00000001;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_208;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
                 (check_type)in_stack_fffffffffffffa10,(size_t)&local_468,0x69);
    }
    else {
      local_478 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_470 = "";
      local_488 = &boost::unit_test::basic_cstring<char_const>::null;
      local_480 = &boost::unit_test::basic_cstring<char_const>::null;
      file_07.m_end = (iterator)0x6d;
      file_07.m_begin = (iterator)&local_478;
      msg_07.m_end = pvVar7;
      msg_07.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_488,
                 msg_07);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_0114a720;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar8;
      bVar2 = VerifyScript(&s,&a_or_b,(CScriptWitness *)0x0,3,(BaseSignatureChecker *)&local_288,
                           &err);
      local_368[0] = (class_property<bool>)(class_property<bool>)!bVar2;
      local_368._8_8_ = (element_type *)0x0;
      aStack_358._M_allocated_capacity = 0;
      tinyformat::format<int>(&local_2a8,"a|b: %d",(int *)&local_32c);
      local_208[8] = '\0';
      local_208._0_8_ = &PTR__lazy_ostream_01147fb0;
      local_208._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_498 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_490 = "";
      pvVar5 = &DAT_00000001;
      pvVar7 = &DAT_00000001;
      local_208._24_8_ = &local_2a8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
                 (check_type)in_stack_fffffffffffffa10,(size_t)&local_498,0x6d);
      std::__cxx11::string::~string((string *)&local_2a8);
      boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
      local_4a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_4a0 = "";
      local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x6e;
      file_08.m_begin = (iterator)&local_4a8;
      msg_08.m_end = pvVar7;
      msg_08.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4b8,
                 msg_08);
      local_2a8._M_dataplus._M_p._0_1_ = err == SCRIPT_ERR_EVAL_FALSE;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_allocated_capacity = 0;
      ScriptErrorString_abi_cxx11_((string *)local_208,err);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01147fb0;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      local_4c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_4c0 = "";
      pvVar5 = &DAT_00000001;
      pvVar7 = &DAT_00000001;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_208;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
                 (check_type)in_stack_fffffffffffffa10,(size_t)&local_4c8,0x6e);
    }
    std::__cxx11::string::~string((string *)local_208);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
    local_32c = local_32c + 1;
  }
  CScript::clear(&s);
  pCVar4 = CScript::operator<<(&s,OP_0);
  CScript::operator<<(pCVar4,OP_1);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x73;
  file_09.m_begin = (iterator)&local_4d8;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4e8,
             msg_09);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR_CheckECDSASignature_0114a720;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = pCVar8;
  bVar2 = VerifyScript(&s,&a_or_b,(CScriptWitness *)0x0,3,(BaseSignatureChecker *)&local_288,&err);
  local_2a8._M_dataplus._M_p._0_1_ = !bVar2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  local_368._0_8_ =
       "!VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_368._8_8_ = "";
  local_208[8] = '\0';
  local_208._0_8_ = &PTR__lazy_ostream_011481f0;
  local_208._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_208._24_8_ = local_368;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_4f0 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a8,(lazy_ostream *)local_208,1,0,WARN,
             (check_type)in_stack_fffffffffffffa10,(size_t)&local_4f8,0x73);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x74;
  file_10.m_begin = (iterator)&local_508;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_518,
             msg_10);
  local_2a8._M_dataplus._M_p._0_1_ = err == SCRIPT_ERR_SIG_DER;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  ScriptErrorString_abi_cxx11_((string *)local_208,err);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01147fb0;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_520 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = &DAT_00000001;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
             (check_type)in_stack_fffffffffffffa10,(size_t)&local_528,0x74);
  std::__cxx11::string::~string((string *)local_208);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
  for (local_32c = 0; (int)local_32c < 4; local_32c = local_32c + 1) {
    local_52c = 0;
    while( true ) {
      pCVar8 = (pointer)(txTo + 2);
      if (3 < local_52c) break;
      std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&keys,1,key + (int)local_32c);
      std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,key + local_52c);
      CTransaction::CTransaction(&local_288,(CMutableTransaction *)pCVar8);
      sign_multisig((CScript *)local_208,&escrow,&keys,&local_288,(int)pvVar5);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&s.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208)
      ;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208);
      CTransaction::~CTransaction(&local_288);
      if (((local_52c < 3) && ((int)local_32c < 3)) && ((int)local_32c < local_52c)) {
        local_540 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_538 = "";
        local_550 = &boost::unit_test::basic_cstring<char_const>::null;
        local_548 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0x7f;
        file_11.m_begin = (iterator)&local_540;
        msg_11.m_end = pvVar7;
        msg_11.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_550
                   ,msg_11);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_0114a720;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pCVar6 = &local_288;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar8;
        bVar2 = VerifyScript(&s,&escrow,(CScriptWitness *)0x0,3,(BaseSignatureChecker *)&local_288,
                             &err);
        local_368[0] = (class_property<bool>)(class_property<bool>)bVar2;
        local_368._8_8_ = (element_type *)0x0;
        aStack_358._M_allocated_capacity = 0;
        tinyformat::format<int,int>
                  (&local_2a8,(tinyformat *)"escrow 1: %d %d",(char *)&local_32c,&local_52c,
                   (int *)pCVar6);
        local_208[8] = '\0';
        local_208._0_8_ = &PTR__lazy_ostream_01147fb0;
        local_208._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_560 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_558 = "";
        pvVar5 = &DAT_00000001;
        pvVar7 = &DAT_00000001;
        local_208._24_8_ = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
                   (check_type)in_stack_fffffffffffffa10,(size_t)&local_560,0x7f);
        std::__cxx11::string::~string((string *)&local_2a8);
        boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
        local_570 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_568 = "";
        local_580 = &boost::unit_test::basic_cstring<char_const>::null;
        local_578 = &boost::unit_test::basic_cstring<char_const>::null;
        file_12.m_end = (iterator)0x80;
        file_12.m_begin = (iterator)&local_570;
        msg_12.m_end = pvVar7;
        msg_12.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_580
                   ,msg_12);
        local_2a8._M_dataplus._M_p._0_1_ = err == SCRIPT_ERR_OK;
        local_2a8._M_string_length = 0;
        local_2a8.field_2._M_allocated_capacity = 0;
        ScriptErrorString_abi_cxx11_((string *)local_208,err);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01147fb0;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_590 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_588 = "";
        pvVar5 = &DAT_00000001;
        pvVar7 = &DAT_00000001;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_208;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
                   (check_type)in_stack_fffffffffffffa10,(size_t)&local_590,0x80);
      }
      else {
        local_5a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_598 = "";
        local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_13.m_end = (iterator)0x84;
        file_13.m_begin = (iterator)&local_5a0;
        msg_13.m_end = pvVar7;
        msg_13.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5b0
                   ,msg_13);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_0114a720;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pCVar6 = &local_288;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar8;
        bVar2 = VerifyScript(&s,&escrow,(CScriptWitness *)0x0,3,(BaseSignatureChecker *)&local_288,
                             &err);
        local_368[0] = (class_property<bool>)(class_property<bool>)!bVar2;
        local_368._8_8_ = (element_type *)0x0;
        aStack_358._M_allocated_capacity = 0;
        tinyformat::format<int,int>
                  (&local_2a8,(tinyformat *)"escrow 2: %d %d",(char *)&local_32c,&local_52c,
                   (int *)pCVar6);
        local_208[8] = '\0';
        local_208._0_8_ = &PTR__lazy_ostream_01147fb0;
        local_208._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_5c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_5b8 = "";
        pvVar5 = &DAT_00000001;
        pvVar7 = &DAT_00000001;
        local_208._24_8_ = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
                   (check_type)in_stack_fffffffffffffa10,(size_t)&local_5c0,0x84);
        std::__cxx11::string::~string((string *)&local_2a8);
        boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
        local_5d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_5c8 = "";
        local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_14.m_end = (iterator)0x85;
        file_14.m_begin = (iterator)&local_5d0;
        msg_14.m_end = pvVar7;
        msg_14.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5e0
                   ,msg_14);
        local_2a8._M_dataplus._M_p._0_1_ = err == SCRIPT_ERR_EVAL_FALSE;
        local_2a8._M_string_length = 0;
        local_2a8.field_2._M_allocated_capacity = 0;
        ScriptErrorString_abi_cxx11_((string *)local_208,err);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01147fb0;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        in_stack_fffffffffffffa10 =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        pvVar5 = &DAT_00000001;
        pvVar7 = &DAT_00000001;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_208;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,0xbbee57,
                   (size_t)&stack0xfffffffffffffa10,0x85);
      }
      std::__cxx11::string::~string((string *)local_208);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
      local_52c = local_52c + 1;
    }
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&s.super_CScriptBase);
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&keys);
  lVar3 = 0x70;
  do {
    CMutableTransaction::~CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x38);
  CMutableTransaction::~CMutableTransaction(&txFrom);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&escrow.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&a_or_b.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&a_and_b.super_CScriptBase);
  lVar3 = 0x38;
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)(&key[0].fCompressed + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(multisig_verify)
{
    unsigned int flags = SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_STRICTENC;

    ScriptError err;
    CKey key[4];
    CAmount amount = 0;
    for (int i = 0; i < 4; i++)
        key[i].MakeNewKey(true);

    CScript a_and_b;
    a_and_b << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript a_or_b;
    a_or_b << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript escrow;
    escrow << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    CMutableTransaction txFrom;  // Funding transaction
    txFrom.vout.resize(3);
    txFrom.vout[0].scriptPubKey = a_and_b;
    txFrom.vout[1].scriptPubKey = a_or_b;
    txFrom.vout[2].scriptPubKey = escrow;

    CMutableTransaction txTo[3]; // Spending transaction
    for (int i = 0; i < 3; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1;
    }

    std::vector<CKey> keys;
    CScript s;

    // Test a AND b:
    keys.assign(1,key[0]);
    keys.push_back(key[1]);
    s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
    BOOST_CHECK(VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    for (int i = 0; i < 4; i++)
    {
        keys.assign(1,key[i]);
        s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
        BOOST_CHECK_MESSAGE(!VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a&b 1: %d", i));
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_INVALID_STACK_OPERATION, ScriptErrorString(err));

        keys.assign(1,key[1]);
        keys.push_back(key[i]);
        s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
        BOOST_CHECK_MESSAGE(!VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a&b 2: %d", i));
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
    }

    // Test a OR b:
    for (int i = 0; i < 4; i++)
    {
        keys.assign(1,key[i]);
        s = sign_multisig(a_or_b, keys, CTransaction(txTo[1]), 0);
        if (i == 0 || i == 1)
        {
            BOOST_CHECK_MESSAGE(VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a|b: %d", i));
            BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
        }
        else
        {
            BOOST_CHECK_MESSAGE(!VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a|b: %d", i));
            BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
        }
    }
    s.clear();
    s << OP_0 << OP_1;
    BOOST_CHECK(!VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_SIG_DER, ScriptErrorString(err));


    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
        {
            keys.assign(1,key[i]);
            keys.push_back(key[j]);
            s = sign_multisig(escrow, keys, CTransaction(txTo[2]), 0);
            if (i < j && i < 3 && j < 3)
            {
                BOOST_CHECK_MESSAGE(VerifyScript(s, escrow, nullptr, flags, MutableTransactionSignatureChecker(&txTo[2], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("escrow 1: %d %d", i, j));
                BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
            }
            else
            {
                BOOST_CHECK_MESSAGE(!VerifyScript(s, escrow, nullptr, flags, MutableTransactionSignatureChecker(&txTo[2], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("escrow 2: %d %d", i, j));
                BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
            }
        }
}